

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderCustomData.cpp
# Opt level: O0

shared_ptr<Assimp::Blender::CustomDataLayer> __thiscall
Assimp::Blender::getCustomDataLayer
          (Blender *this,CustomData *customdata,CustomDataType cdtype,string *name)

{
  const_iterator __lhs;
  bool bVar1;
  __shared_ptr<Assimp::Blender::CustomDataLayer,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  element_type *peVar3;
  reference psVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  shared_ptr<Assimp::Blender::CustomDataLayer> sVar6;
  __normal_iterator<const_std::shared_ptr<Assimp::Blender::CustomDataLayer>_*,_std::vector<std::shared_ptr<Assimp::Blender::CustomDataLayer>,_std::allocator<std::shared_ptr<Assimp::Blender::CustomDataLayer>_>_>_>
  local_38;
  __normal_iterator<const_std::shared_ptr<Assimp::Blender::CustomDataLayer>_*,_std::vector<std::shared_ptr<Assimp::Blender::CustomDataLayer>,_std::allocator<std::shared_ptr<Assimp::Blender::CustomDataLayer>_>_>_>
  local_30;
  const_iterator it;
  string *name_local;
  CustomDataType cdtype_local;
  CustomData *customdata_local;
  
  it._M_current = (shared_ptr<Assimp::Blender::CustomDataLayer> *)name;
  local_30._M_current =
       (shared_ptr<Assimp::Blender::CustomDataLayer> *)
       ::std::
       vector<std::shared_ptr<Assimp::Blender::CustomDataLayer>,_std::allocator<std::shared_ptr<Assimp::Blender::CustomDataLayer>_>_>
       ::begin(&(customdata->layers).
                super_vector<std::shared_ptr<Assimp::Blender::CustomDataLayer>,_std::allocator<std::shared_ptr<Assimp::Blender::CustomDataLayer>_>_>
              );
  do {
    local_38._M_current =
         (shared_ptr<Assimp::Blender::CustomDataLayer> *)
         ::std::
         vector<std::shared_ptr<Assimp::Blender::CustomDataLayer>,_std::allocator<std::shared_ptr<Assimp::Blender::CustomDataLayer>_>_>
         ::end(&(customdata->layers).
                super_vector<std::shared_ptr<Assimp::Blender::CustomDataLayer>,_std::allocator<std::shared_ptr<Assimp::Blender::CustomDataLayer>_>_>
              );
    bVar1 = __gnu_cxx::operator!=(&local_30,&local_38);
    if (!bVar1) {
      ::std::shared_ptr<Assimp::Blender::CustomDataLayer>::shared_ptr
                ((shared_ptr<Assimp::Blender::CustomDataLayer> *)this,(nullptr_t)0x0);
      _Var5._M_pi = extraout_RDX_00;
LAB_007e31b3:
      sVar6.super___shared_ptr<Assimp::Blender::CustomDataLayer,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = _Var5._M_pi;
      sVar6.super___shared_ptr<Assimp::Blender::CustomDataLayer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = (element_type *)this;
      return (shared_ptr<Assimp::Blender::CustomDataLayer>)
             sVar6.super___shared_ptr<Assimp::Blender::CustomDataLayer,_(__gnu_cxx::_Lock_policy)2>;
    }
    p_Var2 = &__gnu_cxx::
              __normal_iterator<const_std::shared_ptr<Assimp::Blender::CustomDataLayer>_*,_std::vector<std::shared_ptr<Assimp::Blender::CustomDataLayer>,_std::allocator<std::shared_ptr<Assimp::Blender::CustomDataLayer>_>_>_>
              ::operator->(&local_30)->
              super___shared_ptr<Assimp::Blender::CustomDataLayer,_(__gnu_cxx::_Lock_policy)2>;
    peVar3 = ::std::__shared_ptr<Assimp::Blender::CustomDataLayer,_(__gnu_cxx::_Lock_policy)2>::get
                       (p_Var2);
    __lhs = it;
    if (peVar3->type == cdtype) {
      p_Var2 = &__gnu_cxx::
                __normal_iterator<const_std::shared_ptr<Assimp::Blender::CustomDataLayer>_*,_std::vector<std::shared_ptr<Assimp::Blender::CustomDataLayer>,_std::allocator<std::shared_ptr<Assimp::Blender::CustomDataLayer>_>_>_>
                ::operator->(&local_30)->
                super___shared_ptr<Assimp::Blender::CustomDataLayer,_(__gnu_cxx::_Lock_policy)2>;
      peVar3 = ::std::__shared_ptr<Assimp::Blender::CustomDataLayer,_(__gnu_cxx::_Lock_policy)2>::
               get(p_Var2);
      bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )__lhs._M_current,peVar3->name);
      if (bVar1) {
        psVar4 = __gnu_cxx::
                 __normal_iterator<const_std::shared_ptr<Assimp::Blender::CustomDataLayer>_*,_std::vector<std::shared_ptr<Assimp::Blender::CustomDataLayer>,_std::allocator<std::shared_ptr<Assimp::Blender::CustomDataLayer>_>_>_>
                 ::operator*(&local_30);
        ::std::shared_ptr<Assimp::Blender::CustomDataLayer>::shared_ptr
                  ((shared_ptr<Assimp::Blender::CustomDataLayer> *)this,psVar4);
        _Var5._M_pi = extraout_RDX;
        goto LAB_007e31b3;
      }
    }
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<Assimp::Blender::CustomDataLayer>_*,_std::vector<std::shared_ptr<Assimp::Blender::CustomDataLayer>,_std::allocator<std::shared_ptr<Assimp::Blender::CustomDataLayer>_>_>_>
    ::operator++(&local_30);
  } while( true );
}

Assistant:

std::shared_ptr<CustomDataLayer> getCustomDataLayer(const CustomData &customdata, const CustomDataType cdtype, const std::string &name) {
            for (auto it = customdata.layers.begin(); it != customdata.layers.end(); ++it) {
                if (it->get()->type == cdtype && name == it->get()->name) {
                    return *it;
                }
            }
            return nullptr;
        }